

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O2

FailCodeType_conflict __thiscall
mittens::UnHandler<double>::handleException(UnHandler<double> *this)

{
  logic_error *this_00;
  undefined8 uVar1;
  exception_ptr eptr;
  undefined1 local_18 [8];
  
  std::current_exception();
  if (eptr._M_exception_object == (void *)0x0) {
    std::__exception_ptr::exception_ptr::~exception_ptr(&eptr);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Mittens handler called outside of a catch clause! This is a BUG.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_18,&eptr);
  uVar1 = std::rethrow_exception((exception_ptr)local_18);
  __cxa_free_exception();
  _Unwind_Resume(uVar1);
}

Assistant:

FailCodeType handleException()
      {
         // Instead of a call to `throw` we will check if the function was called inside a
         // catch clause. If so, `std::rethrow_exception(eptr)` is the same as `throw`.
         // Otherwise, throw an `std::logic_error` since this is obviously a bug.
         if (std::exception_ptr eptr = std::current_exception())
            std::rethrow_exception(eptr);

         throw std::logic_error("Mittens handler called outside of a catch clause! This is a BUG.");
      }